

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O3

Var Js::Math::Atan2(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  double dVar6;
  int in_stack_00000010;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x11e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d2fbda;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_50 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_50,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)local_50 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x11f,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00d2fbda;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x122,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d2fbda;
    *puVar4 = 0;
  }
  if ((local_50._0_4_ & 0xffffff) < 3) {
    return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nan.
           ptr;
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_50,1);
  if (((ulong)pvVar5 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d2fabe;
    if ((ulong)pvVar5 >> 0x32 == 0) {
      callInfo_local = (CallInfo)JavascriptConversion::ToNumber_Full(pvVar5,pSVar1);
    }
    else {
      callInfo_local = (CallInfo)((ulong)pvVar5 ^ 0xfffc000000000000);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00d2fbda;
    *puVar4 = 0;
LAB_00d2fabe:
    callInfo_local = (CallInfo)(double)(int)pvVar5;
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_50,2);
  if (((ulong)pvVar5 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)pvVar5 >> 0x32 == 0) {
        dVar6 = JavascriptConversion::ToNumber_Full(pvVar5,pSVar1);
      }
      else {
        dVar6 = (double)((ulong)pvVar5 ^ 0xfffc000000000000);
      }
      goto LAB_00d2fb5c;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) {
LAB_00d2fbda:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  dVar6 = (double)(int)pvVar5;
LAB_00d2fb5c:
  dVar6 = atan2((double)callInfo_local,dVar6);
  pvVar5 = JavascriptNumber::ToVarNoCheck(dVar6,pSVar1);
  return pvVar5;
}

Assistant:

Var Math::Atan2(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count >= 3)
        {
            double x = JavascriptConversion::ToNumber(args[1], scriptContext);
            double y = JavascriptConversion::ToNumber(args[2], scriptContext);
            double result = Math::Atan2(x,y);
            return JavascriptNumber::ToVarNoCheck(result, scriptContext);
        }
        else
        {
            return scriptContext->GetLibrary()->GetNaN();
        }
    }